

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void test_ecmult_accumulate(secp256k1_sha256 *acc,secp256k1_scalar *x,secp256k1_scratch *scratch)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  size_t sStackY_500;
  size_t size;
  secp256k1_ge r;
  uchar bytes [65];
  secp256k1_gej rj6;
  secp256k1_gej rj5;
  secp256k1_gej rj4;
  secp256k1_gej rj3;
  secp256k1_gej rj2;
  secp256k1_gej rj1;
  secp256k1_gej infj;
  secp256k1_gej gj;
  
  size = 0x41;
  gj.infinity = 0;
  gj.x.n[0] = 0x2815b16f81798;
  gj.x.n[1] = 0xdb2dce28d959f;
  gj.x.n[2] = 0xe870b07029bfc;
  gj.x.n[3] = 0xbbac55a06295c;
  gj.x.n[4] = 0x79be667ef9dc;
  gj.y.n[4] = 0x483ada7726a3;
  gj.y.n[0] = 0x7d08ffb10d4b8;
  gj.y.n[1] = 0x48a68554199c4;
  gj.y.n[2] = 0xe1108a8fd17b4;
  gj.y.n[3] = 0xc4655da4fbfc0;
  gj.z.n[0] = 1;
  gj.z.n[1] = 0;
  gj.z.n[2] = 0;
  gj.z.n[3] = 0;
  gj.z.n[4] = 0;
  infj.infinity = 1;
  infj.z.n[2] = 0;
  infj.z.n[3] = 0;
  infj.z.n[0] = 0;
  infj.z.n[1] = 0;
  infj.y.n[3] = 0;
  infj.y.n[4] = 0;
  infj.y.n[1] = 0;
  infj.y.n[2] = 0;
  infj.x.n[4] = 0;
  infj.y.n[0] = 0;
  infj.x.n[2] = 0;
  infj.x.n[3] = 0;
  infj.x.n[0] = 0;
  infj.x.n[1] = 0;
  infj.z.n[4] = 0;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&rj1,x);
  secp256k1_ecmult(&rj2,&gj,x,&secp256k1_scalar_zero);
  secp256k1_ecmult(&rj3,&infj,&secp256k1_scalar_zero,x);
  iVar1 = secp256k1_ecmult_multi_var
                    (&CTX->error_callback,scratch,&rj4,x,(secp256k1_ecmult_multi_callback *)0x0,
                     (void *)0x0,0);
  if (iVar1 == 0) {
    pcVar3 = 
    "test condition failed: secp256k1_ecmult_multi_var(&CTX->error_callback, scratch, &rj4, x, NULL, NULL, 0)"
    ;
    uVar2 = 0x1521;
  }
  else {
    iVar1 = secp256k1_ecmult_multi_var
                      (&CTX->error_callback,scratch,&rj5,&secp256k1_scalar_zero,
                       test_ecmult_accumulate_cb,x,1);
    if (iVar1 == 0) {
      pcVar3 = 
      "test condition failed: secp256k1_ecmult_multi_var(&CTX->error_callback, scratch, &rj5, &secp256k1_scalar_zero, test_ecmult_accumulate_cb, (void*)x, 1)"
      ;
      uVar2 = 0x1522;
    }
    else {
      secp256k1_ecmult_const(&rj6,&secp256k1_ge_const_g,x);
      secp256k1_ge_set_gej_var(&r,&rj1);
      iVar1 = secp256k1_gej_eq_ge_var(&rj2,&r);
      if (iVar1 == 0) {
        pcVar3 = "test condition failed: secp256k1_gej_eq_ge_var(&rj2, &r)";
        uVar2 = 0x1525;
      }
      else {
        iVar1 = secp256k1_gej_eq_ge_var(&rj3,&r);
        if (iVar1 == 0) {
          pcVar3 = "test condition failed: secp256k1_gej_eq_ge_var(&rj3, &r)";
          uVar2 = 0x1526;
        }
        else {
          iVar1 = secp256k1_gej_eq_ge_var(&rj4,&r);
          if (iVar1 == 0) {
            pcVar3 = "test condition failed: secp256k1_gej_eq_ge_var(&rj4, &r)";
            uVar2 = 0x1527;
          }
          else {
            iVar1 = secp256k1_gej_eq_ge_var(&rj5,&r);
            if (iVar1 == 0) {
              pcVar3 = "test condition failed: secp256k1_gej_eq_ge_var(&rj5, &r)";
              uVar2 = 0x1528;
            }
            else {
              iVar1 = secp256k1_gej_eq_ge_var(&rj6,&r);
              if (iVar1 != 0) {
                if (r.infinity == 0) {
                  secp256k1_eckey_pubkey_serialize(&r,bytes,&size,0);
                  if (size != 0x41) {
                    pcVar3 = "test condition failed: size == 65";
                    uVar2 = 0x1531;
                    goto LAB_00131eb2;
                  }
                  sStackY_500 = 0x41;
                }
                else {
                  bytes[0] = '\0';
                  sStackY_500 = 1;
                }
                secp256k1_sha256_write(acc,bytes,sStackY_500);
                return;
              }
              pcVar3 = "test condition failed: secp256k1_gej_eq_ge_var(&rj6, &r)";
              uVar2 = 0x1529;
            }
          }
        }
      }
    }
  }
LAB_00131eb2:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void test_ecmult_accumulate(secp256k1_sha256* acc, const secp256k1_scalar* x, secp256k1_scratch* scratch) {
    /* Compute x*G in 6 different ways, serialize it uncompressed, and feed it into acc. */
    secp256k1_gej rj1, rj2, rj3, rj4, rj5, rj6, gj, infj;
    secp256k1_ge r;
    unsigned char bytes[65];
    size_t size = 65;
    secp256k1_gej_set_ge(&gj, &secp256k1_ge_const_g);
    secp256k1_gej_set_infinity(&infj);
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &rj1, x);
    secp256k1_ecmult(&rj2, &gj, x, &secp256k1_scalar_zero);
    secp256k1_ecmult(&rj3, &infj, &secp256k1_scalar_zero, x);
    CHECK(secp256k1_ecmult_multi_var(&CTX->error_callback, scratch, &rj4, x, NULL, NULL, 0));
    CHECK(secp256k1_ecmult_multi_var(&CTX->error_callback, scratch, &rj5, &secp256k1_scalar_zero, test_ecmult_accumulate_cb, (void*)x, 1));
    secp256k1_ecmult_const(&rj6, &secp256k1_ge_const_g, x);
    secp256k1_ge_set_gej_var(&r, &rj1);
    CHECK(secp256k1_gej_eq_ge_var(&rj2, &r));
    CHECK(secp256k1_gej_eq_ge_var(&rj3, &r));
    CHECK(secp256k1_gej_eq_ge_var(&rj4, &r));
    CHECK(secp256k1_gej_eq_ge_var(&rj5, &r));
    CHECK(secp256k1_gej_eq_ge_var(&rj6, &r));
    if (secp256k1_ge_is_infinity(&r)) {
        /* Store infinity as 0x00 */
        const unsigned char zerobyte[1] = {0};
        secp256k1_sha256_write(acc, zerobyte, 1);
    } else {
        /* Store other points using their uncompressed serialization. */
        secp256k1_eckey_pubkey_serialize(&r, bytes, &size, 0);
        CHECK(size == 65);
        secp256k1_sha256_write(acc, bytes, size);
    }
}